

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O0

bool yywrap(void)

{
  LexerState **ppLVar1;
  FileStackNode *__src;
  Context *__ptr;
  uint32_t uVar2;
  size_t __size;
  int *piVar3;
  Symbol *pSVar4;
  char *pcVar5;
  Context *context;
  Symbol *sym;
  uint32_t forValue;
  FileStackReptNode *copy;
  size_t size;
  FileStackReptNode *fileInfo;
  uint32_t ifDepth;
  
  uVar2 = lexer_GetIFDepth();
  if (uVar2 != 0) {
    pcVar5 = "s";
    if (uVar2 == 1) {
      pcVar5 = "";
    }
    fatalerror("Ended block with %u unterminated IF construct%s\n",(ulong)uVar2,pcVar5);
  }
  if (contextStack->fileInfo->type == NODE_REPT) {
    __src = contextStack->fileInfo;
    size = (size_t)__src;
    if ((contextStack->fileInfo->referenced & 1U) != 0) {
      __size = (ulong)*(uint *)&__src[1].parent * 4 + 0x30;
      size = (size_t)malloc(__size);
      if ((FileStackNode *)size == (FileStackNode *)0x0) {
        piVar3 = __errno_location();
        pcVar5 = strerror(*piVar3);
        fatalerror("Failed to duplicate REPT file node: %s\n",pcVar5);
      }
      memcpy((void *)size,__src,__size);
      ((FileStackNode *)size)->next = (FileStackNode *)0x0;
      ((FileStackNode *)size)->referenced = false;
      contextStack->fileInfo = (FileStackNode *)size;
    }
    if ((contextStack->forName != (char *)0x0) &&
       (*(uint *)(size + 0x2c) <= contextStack->nbReptIters)) {
      contextStack->forValue = contextStack->forValue + contextStack->forStep;
      pSVar4 = sym_AddVar(contextStack->forName,contextStack->forValue);
      if (pSVar4->type != SYM_VAR) {
        fatalerror("Failed to update FOR symbol value\n");
      }
    }
    *(int *)(size + 0x2c) = *(int *)(size + 0x2c) + 1;
    if (*(uint *)(size + 0x2c) <= contextStack->nbReptIters) {
      lexer_RestartRept(contextStack->fileInfo->lineNo);
      uVar2 = macro_UseNewUniqueID();
      contextStack->uniqueID = uVar2;
      return false;
    }
  }
  else if (contextStack->parent == (Context *)0x0) {
    return true;
  }
  __ptr = contextStack;
  if (contextDepth != 0) {
    contextDepth = contextDepth - 1;
    ppLVar1 = &contextStack->lexerState;
    contextStack = contextStack->parent;
    lexer_DeleteState(*ppLVar1);
    if (__ptr->fileInfo->type == NODE_MACRO) {
      macro_UseNewArgs(contextStack->macroArgs);
    }
    if ((__ptr->fileInfo->referenced & 1U) == 0) {
      free(__ptr->fileInfo);
    }
    free(__ptr->forName);
    free(__ptr);
    lexer_SetState(contextStack->lexerState);
    macro_SetUniqueID(contextStack->uniqueID);
    return false;
  }
  contextStack = contextStack->parent;
  __assert_fail("contextDepth != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/fstack.cpp"
                ,0x10e,"yywrap");
}

Assistant:

bool yywrap(void)
{
	uint32_t ifDepth = lexer_GetIFDepth();

	if (ifDepth != 0)
		fatalerror("Ended block with %" PRIu32 " unterminated IF construct%s\n",
			   ifDepth, ifDepth == 1 ? "" : "s");

	if (contextStack->fileInfo->type == NODE_REPT) {
		// The context is a REPT or FOR block, which may loop
		struct FileStackReptNode *fileInfo = (struct FileStackReptNode *)contextStack->fileInfo;

		// If the node is referenced, we can't edit it; duplicate it
		if (contextStack->fileInfo->referenced) {
			size_t size = sizeof(*fileInfo) + sizeof(fileInfo->iters[0]) * fileInfo->reptDepth;
			struct FileStackReptNode *copy = (struct FileStackReptNode *)malloc(size);

			if (!copy)
				fatalerror("Failed to duplicate REPT file node: %s\n", strerror(errno));
			// Copy all info but the referencing
			memcpy(copy, fileInfo, size);
			copy->node.next = NULL;
			copy->node.referenced = false;

			fileInfo = copy;
			contextStack->fileInfo = (struct FileStackNode *)fileInfo;
		}

		// If this is a FOR, update the symbol value
		if (contextStack->forName && fileInfo->iters[0] <= contextStack->nbReptIters) {
			// Avoid arithmetic overflow runtime error
			uint32_t forValue = (uint32_t)contextStack->forValue +
				(uint32_t)contextStack->forStep;
			contextStack->forValue = forValue >= 0 ? (int32_t)forValue
				: -(int32_t)~forValue - 1;
			struct Symbol *sym = sym_AddVar(contextStack->forName,
				contextStack->forValue);

			// This error message will refer to the current iteration
			if (sym->type != SYM_VAR)
				fatalerror("Failed to update FOR symbol value\n");
		}
		// Advance to the next iteration
		fileInfo->iters[0]++;
		// If this wasn't the last iteration, wrap instead of popping
		if (fileInfo->iters[0] <= contextStack->nbReptIters) {
			lexer_RestartRept(contextStack->fileInfo->lineNo);
			contextStack->uniqueID = macro_UseNewUniqueID();
			return false;
		}
	} else if (!contextStack->parent) {
		return true;
	}

	struct Context *context = contextStack;

	contextStack = contextStack->parent;
	assert(contextDepth != 0); // This is never supposed to underflow
	contextDepth--;

	lexer_DeleteState(context->lexerState);
	// Restore args if a macro (not REPT) saved them
	if (context->fileInfo->type == NODE_MACRO)
		macro_UseNewArgs(contextStack->macroArgs);
	// Free the file stack node
	if (!context->fileInfo->referenced)
		free(context->fileInfo);
	// Free the FOR symbol name
	free(context->forName);
	// Free the entry and make its parent the current entry
	free(context);

	lexer_SetState(contextStack->lexerState);
	macro_SetUniqueID(contextStack->uniqueID);

	return false;
}